

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void init_fields(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  _Alloc_hider _Var39;
  size_type sVar40;
  _Alloc_hider _Var41;
  size_type sVar42;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> uVar43;
  bool bVar44;
  bool bVar45;
  ostream *poVar46;
  long lVar47;
  __uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_> _Var48;
  ulong uVar49;
  uint uVar50;
  uint uVar51;
  long lVar52;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  double dVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double dVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  double dVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined8 uVar155;
  undefined8 in_XMM12_Qb;
  undefined8 in_XMM13_Qb;
  undefined8 in_XMM14_Qb;
  allocator local_f1;
  string f_reflection2;
  string f_reflection3;
  string f_reflection1;
  string lp_reflection2;
  string lp_reflection3;
  string lp_reflection1;
  
  lVar47 = (long)mpi_rank;
  bVar44 = std::operator==(&f_envelope_abi_cxx11_,"focused");
  sVar42 = f_reflection_abi_cxx11_._M_string_length;
  _Var41 = f_reflection_abi_cxx11_._M_dataplus;
  sVar40 = lp_reflection_abi_cxx11_._M_string_length;
  _Var39 = lp_reflection_abi_cxx11_._M_dataplus;
  if (!bVar44) {
    bVar44 = std::operator==(&f_envelope_abi_cxx11_,"uniformB");
    if (bVar44) {
      spatial_region::f_init_uniformB
                ((spatial_region *)
                 psr._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z);
      return;
    }
    bVar44 = std::operator!=(&f_envelope_abi_cxx11_,"cos");
    if ((bVar44) && (mpi_rank == 0)) {
      poVar46 = std::operator<<((ostream *)&std::cout,(string *)&TERM_RED_abi_cxx11_);
      poVar46 = std::operator<<(poVar46,"Unknown f_envelope value [");
      poVar46 = std::operator<<(poVar46,(string *)&f_envelope_abi_cxx11_);
      poVar46 = std::operator<<(poVar46,"] during initialization");
      poVar46 = std::operator<<(poVar46,(string *)&TERM_NO_COLOR_abi_cxx11_);
      std::endl<char,std::char_traits<char>>(poVar46);
    }
    sVar42 = f_reflection_abi_cxx11_._M_string_length;
    _Var41._M_p = f_reflection_abi_cxx11_._M_dataplus._M_p;
    sVar40 = lp_reflection_abi_cxx11_._M_string_length;
    _Var39._M_p = lp_reflection_abi_cxx11_._M_dataplus._M_p;
    std::__cxx11::string::string((string *)&lp_reflection1,"",(allocator *)&lp_reflection2);
    std::__cxx11::string::string((string *)&lp_reflection2,"",(allocator *)&lp_reflection3);
    std::__cxx11::string::string((string *)&lp_reflection3,"",(allocator *)&f_reflection1);
    std::__cxx11::string::string((string *)&f_reflection1,"",(allocator *)&f_reflection2);
    std::__cxx11::string::string((string *)&f_reflection2,"",(allocator *)&f_reflection3);
    std::__cxx11::string::string((string *)&f_reflection3,"",&local_f1);
    uVar50 = (uint)sVar40;
    uVar51 = ~((int)uVar50 >> 0x1f) & uVar50;
    for (uVar49 = 0; uVar51 != uVar49; uVar49 = uVar49 + 1) {
      if (_Var39._M_p[uVar49] == '&') {
        uVar51 = (uint)uVar49;
        break;
      }
      std::__cxx11::string::push_back((char)&lp_reflection1);
    }
    uVar49 = (ulong)(uVar51 + 1);
    if ((int)(uVar51 + 1) < (int)uVar50) {
      uVar49 = (ulong)uVar51;
      while (uVar49 = uVar49 + 1, (long)uVar49 < (long)(int)uVar50) {
        if (_Var39._M_p[uVar49] == '&') goto LAB_001176ea;
        std::__cxx11::string::push_back((char)&lp_reflection2);
      }
      uVar49 = sVar40 & 0xffffffff;
    }
LAB_001176ea:
    if ((int)uVar49 + 1 < (int)uVar50) {
      lVar52 = (long)(int)uVar49;
      while ((lVar52 = lVar52 + 1, lVar52 < (int)uVar50 && (_Var39._M_p[lVar52] != '&'))) {
        std::__cxx11::string::push_back((char)&lp_reflection3);
      }
    }
    uVar51 = (uint)sVar42;
    uVar50 = ~((int)uVar51 >> 0x1f) & uVar51;
    for (uVar49 = 0; uVar50 != uVar49; uVar49 = uVar49 + 1) {
      if (_Var41._M_p[uVar49] == '&') {
        uVar50 = (uint)uVar49;
        break;
      }
      std::__cxx11::string::push_back((char)&f_reflection1);
    }
    uVar49 = (ulong)(uVar50 + 1);
    if ((int)(uVar50 + 1) < (int)uVar51) {
      uVar49 = (ulong)uVar50;
      while (uVar49 = uVar49 + 1, (long)uVar49 < (long)(int)uVar51) {
        if (_Var41._M_p[uVar49] == '&') goto LAB_00117794;
        std::__cxx11::string::push_back((char)&f_reflection2);
      }
      uVar49 = sVar42 & 0xffffffff;
    }
LAB_00117794:
    if ((int)uVar49 + 1 < (int)uVar51) {
      lVar52 = (long)(int)uVar49;
      while ((lVar52 = lVar52 + 1, lVar52 < (int)uVar51 && (_Var41._M_p[lVar52] != '&'))) {
        std::__cxx11::string::push_back((char)&f_reflection3);
      }
    }
    uVar155 = 0;
    auVar117._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar47];
    auVar117._8_8_ = in_XMM14_Qb;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dx;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = xlength * 0.5 + x0;
    auVar38 = vfnmadd132sd_fma(auVar117,auVar149,auVar38);
    dVar56 = auVar38._0_8_;
    _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
         super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
    dVar151 = z00;
    dVar116 = y00;
    dVar148 = a0z;
    dVar57 = x0;
    dVar54 = phi_rotate;
    dVar55 = a0y;
    if ((phi_rotate == 0.0) && (!NAN(phi_rotate))) {
      spatial_region::f_init_cos
                ((spatial_region *)
                 psr._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z,xsigma,ysigma,
                 zsigma,dVar56,sscos,b_sign,x0,phase,y00,z00,true,0.0,xtarget,ytarget,ztarget);
      if ((phi != 0.0) || (NAN(phi))) {
        dVar116 = -y00;
        auVar118._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar118._8_8_ = in_XMM14_Qb;
        dVar57 = -x0;
        dVar151 = -z00;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dx;
        auVar150._8_8_ = 0;
        auVar150._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar118,auVar150,auVar14);
        dVar56 = auVar38._0_8_;
        _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        dVar148 = a0z;
        dVar54 = phi;
        dVar55 = a0y;
      }
      else {
        bVar44 = std::operator==(&lp_reflection1,"xy");
        uVar43 = psr;
        if (bVar44) {
          bVar44 = std::operator==(&f_reflection1,"y");
          dVar151 = -a0y;
          lVar52 = (ulong)!bVar44 * (long)a0y;
          bVar45 = std::operator==(&f_reflection1,"z");
          auVar152._0_8_ = -z00;
          auVar152._8_8_ = 0x8000000000000000;
          auVar119._0_8_ =
               (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar47];
          auVar119._8_8_ = in_XMM14_Qb;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dx;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = xlength * 0.5 + x0;
          auVar38 = vfnmadd132sd_fma(auVar119,auVar81,auVar22);
          dVar56 = (double)vmovlpd_avx(auVar152);
          spatial_region::f_init_cos
                    ((spatial_region *)
                     uVar43._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                     (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                     (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,ysigma
                     ,zsigma,auVar38._0_8_,sscos,b_sign,x0,phase,y00,dVar56,true,0.0,xtarget,ytarget
                     ,ztarget);
          bVar44 = std::operator==(&lp_reflection2,"xz");
          uVar43 = psr;
          if (bVar44) {
            bVar44 = std::operator==(&f_reflection2,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar120._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar120._8_8_ = uVar155;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = dx;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = xlength * 0.5 + x0;
            auVar38 = vfnmadd132sd_fma(auVar120,auVar82,auVar23);
            auVar83._0_8_ = -y00;
            auVar83._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar83);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,x0,phase,dVar56,z00,true,0.0,xtarget
                       ,ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection2,"y");
            dVar56 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar121._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar121._8_8_ = uVar155;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dx;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = xlength * 0.5 + x0;
            auVar117 = vfnmadd132sd_fma(auVar121,auVar84,auVar24);
            auVar85._8_8_ = 0;
            auVar85._0_8_ = y00;
            auVar38 = vmovhpd_avx(auVar85,z00);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar117._0_8_,sscos,b_sign,x0,phase,-auVar38._0_8_,
                       -auVar38._8_8_,true,0.0,xtarget,ytarget,ztarget);
            bVar44 = std::operator==(&lp_reflection3,"yz");
            uVar43 = psr;
            if (!bVar44) goto LAB_0011947d;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar56 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar122._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar122._8_8_ = uVar155;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = dx;
            auVar138._8_8_ = 0;
            auVar138._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar122,auVar138,auVar25);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,y00,z00,true,0.0,xtarget,
                       ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar153._0_8_ = -z00;
            auVar153._8_8_ = 0x8000000000000000;
            auVar123._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar123._8_8_ = uVar155;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = dx;
            auVar139._8_8_ = 0;
            auVar139._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar123,auVar139,auVar26);
            dVar56 = (double)vmovlpd_avx(auVar153);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,y00,dVar56,true,0.0,
                       xtarget,ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar124._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar124._8_8_ = uVar155;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dx;
            auVar140._8_8_ = 0;
            auVar140._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar124,auVar140,auVar27);
            auVar86._0_8_ = -y00;
            auVar86._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar86);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,dVar56,z00,true,0.0,
                       xtarget,ytarget,ztarget);
            _Var48._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar55 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
            bVar44 = std::operator==(&f_reflection2,"z");
            dVar148 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
            auVar125._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar125._8_8_ = uVar155;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = dx;
            auVar141._8_8_ = 0;
            auVar141._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar125,auVar141,auVar28);
            dVar56 = auVar38._0_8_;
            dVar57 = -x0;
          }
          else {
            bVar44 = std::operator==(&lp_reflection2,"yz");
            uVar43 = psr;
            if (!bVar44) goto LAB_0011947d;
            bVar44 = std::operator==(&f_reflection2,"y");
            dVar56 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar129._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar129._8_8_ = uVar155;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dx;
            auVar144._8_8_ = 0;
            auVar144._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar129,auVar144,auVar32);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,y00,z00,true,0.0,xtarget,
                       ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection2,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar154._0_8_ = -z00;
            auVar154._8_8_ = 0x8000000000000000;
            auVar130._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar130._8_8_ = uVar155;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = dx;
            auVar145._8_8_ = 0;
            auVar145._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar130,auVar145,auVar33);
            dVar56 = (double)vmovlpd_avx(auVar154);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,y00,dVar56,true,0.0,
                       xtarget,ytarget,ztarget);
            bVar44 = std::operator==(&lp_reflection3,"xz");
            uVar43 = psr;
            if (!bVar44) goto LAB_0011947d;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar131._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar131._8_8_ = uVar155;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dx;
            auVar146._8_8_ = 0;
            auVar146._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar131,auVar146,auVar34);
            auVar90._0_8_ = -y00;
            auVar90._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar90);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,dVar56,z00,true,0.0,
                       xtarget,ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar132._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar132._8_8_ = uVar155;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = dx;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = x0 + xlength * 0.5;
            auVar38 = vfnmadd132sd_fma(auVar132,auVar91,auVar35);
            auVar92._0_8_ = -y00;
            auVar92._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar92);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,x0,phase,dVar56,z00,true,0.0,xtarget
                       ,ytarget,ztarget);
            uVar43 = psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar56 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar133._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar133._8_8_ = uVar155;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = dx;
            auVar147._8_8_ = 0;
            auVar147._0_8_ = xlength * 0.5 - x0;
            auVar117 = vfnmadd132sd_fma(auVar133,auVar147,auVar36);
            auVar93._8_8_ = 0;
            auVar93._0_8_ = y00;
            auVar38 = vmovhpd_avx(auVar93,z00);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar117._0_8_,sscos,b_sign,-x0,phase,-auVar38._0_8_,
                       -auVar38._8_8_,true,0.0,xtarget,ytarget,ztarget);
            _Var48._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            bVar44 = std::operator==(&f_reflection3,"y");
            dVar55 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
            bVar44 = std::operator==(&f_reflection2,"z");
            dVar148 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
            auVar134._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar134._8_8_ = uVar155;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dx;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = x0 + xlength * 0.5;
            auVar38 = vfnmadd132sd_fma(auVar134,auVar94,auVar37);
            dVar56 = auVar38._0_8_;
            dVar57 = x0;
          }
          dVar116 = -y00;
          dVar151 = -z00;
        }
        else {
          bVar44 = std::operator==(&lp_reflection1,"xz");
          uVar43 = psr;
          if (bVar44) {
            bVar44 = std::operator==(&f_reflection1,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection1,"z");
            auVar126._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar126._8_8_ = in_XMM14_Qb;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = dx;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = xlength * 0.5 + x0;
            auVar38 = vfnmadd132sd_fma(auVar126,auVar87,auVar29);
            auVar88._0_8_ = -y00;
            auVar88._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar88);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,x0,phase,dVar56,z00,true,0.0,xtarget
                       ,ytarget,ztarget);
            bVar44 = std::operator==(&lp_reflection2,"yz");
            uVar43 = psr;
            if (!bVar44) goto LAB_0011947d;
            bVar44 = std::operator==(&f_reflection2,"y");
            dVar151 = -a0y;
            lVar52 = (ulong)!bVar44 * (long)a0y;
            bVar45 = std::operator==(&f_reflection2,"z");
            auVar127._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar47];
            auVar127._8_8_ = uVar155;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = dx;
            auVar142._8_8_ = 0;
            auVar142._0_8_ = xlength * 0.5 - x0;
            auVar38 = vfnmadd132sd_fma(auVar127,auVar142,auVar30);
            auVar89._0_8_ = -y00;
            auVar89._8_8_ = 0x8000000000000000;
            dVar56 = (double)vmovlpd_avx(auVar89);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                       (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,
                       ysigma,zsigma,auVar38._0_8_,sscos,b_sign,-x0,phase,dVar56,z00,true,0.0,
                       xtarget,ytarget,ztarget);
            _Var48._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            pbVar53 = &f_reflection2;
            bVar44 = std::operator==(pbVar53,"y");
          }
          else {
            bVar44 = std::operator==(&lp_reflection1,"yz");
            _Var48._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            if (!bVar44) goto LAB_0011947d;
            pbVar53 = &f_reflection1;
            bVar44 = std::operator==(pbVar53,"y");
          }
          dVar55 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
          bVar44 = std::operator==(pbVar53,"z");
          dVar148 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
          auVar128._0_8_ =
               (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar47];
          auVar128._8_8_ = in_XMM14_Qb;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dx;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = xlength * 0.5 - x0;
          auVar38 = vfnmadd132sd_fma(auVar128,auVar143,auVar31);
          dVar56 = auVar38._0_8_;
          dVar57 = -x0;
          dVar116 = y00;
          dVar151 = z00;
        }
        dVar54 = 0.0;
      }
    }
    spatial_region::f_init_cos
              ((spatial_region *)
               _Var48._M_t.
               super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar55,dVar148,xsigma,
               ysigma,zsigma,dVar56,sscos,b_sign,dVar57,phase,dVar116,dVar151,true,dVar54,xtarget,
               ytarget,ztarget);
    goto LAB_0011947d;
  }
  std::__cxx11::string::string((string *)&lp_reflection1,"",(allocator *)&lp_reflection2);
  std::__cxx11::string::string((string *)&lp_reflection2,"",(allocator *)&lp_reflection3);
  std::__cxx11::string::string((string *)&lp_reflection3,"",(allocator *)&f_reflection1);
  std::__cxx11::string::string((string *)&f_reflection1,"",(allocator *)&f_reflection2);
  std::__cxx11::string::string((string *)&f_reflection2,"",(allocator *)&f_reflection3);
  std::__cxx11::string::string((string *)&f_reflection3,"",&local_f1);
  uVar51 = (uint)sVar40;
  uVar50 = ~((int)uVar51 >> 0x1f) & uVar51;
  for (uVar49 = 0; uVar50 != uVar49; uVar49 = uVar49 + 1) {
    if (_Var39._M_p[uVar49] == '&') {
      uVar50 = (uint)uVar49;
      break;
    }
    std::__cxx11::string::push_back((char)&lp_reflection1);
  }
  uVar49 = (ulong)(uVar50 + 1);
  if ((int)(uVar50 + 1) < (int)uVar51) {
    uVar49 = (ulong)uVar50;
    while (uVar49 = uVar49 + 1, (long)uVar49 < (long)(int)uVar51) {
      if (_Var39._M_p[uVar49] == '&') goto LAB_001167dc;
      std::__cxx11::string::push_back((char)&lp_reflection2);
    }
    uVar49 = sVar40 & 0xffffffff;
  }
LAB_001167dc:
  if ((int)uVar49 + 1 < (int)uVar51) {
    lVar52 = (long)(int)uVar49;
    while ((lVar52 = lVar52 + 1, lVar52 < (int)uVar51 && (_Var39._M_p[lVar52] != '&'))) {
      std::__cxx11::string::push_back((char)&lp_reflection3);
    }
  }
  uVar51 = (uint)sVar42;
  uVar50 = ~((int)uVar51 >> 0x1f) & uVar51;
  for (uVar49 = 0; uVar50 != uVar49; uVar49 = uVar49 + 1) {
    if (_Var41._M_p[uVar49] == '&') {
      uVar50 = (uint)uVar49;
      break;
    }
    std::__cxx11::string::push_back((char)&f_reflection1);
  }
  uVar49 = (ulong)(uVar50 + 1);
  if ((int)(uVar50 + 1) < (int)uVar51) {
    uVar49 = (ulong)uVar50;
    while (uVar49 = uVar49 + 1, (long)uVar49 < (long)(int)uVar51) {
      if (_Var41._M_p[uVar49] == '&') goto LAB_00116886;
      std::__cxx11::string::push_back((char)&f_reflection2);
    }
    uVar49 = sVar42 & 0xffffffff;
  }
LAB_00116886:
  if ((int)uVar49 + 1 < (int)uVar51) {
    lVar52 = (long)(int)uVar49;
    while ((lVar52 = lVar52 + 1, lVar52 < (int)uVar51 && (_Var41._M_p[lVar52] != '&'))) {
      std::__cxx11::string::push_back((char)&f_reflection3);
    }
  }
  if ((shenergy != 0.0) || (NAN(shenergy))) {
    dVar56 = 1.0 - shenergy;
    if (dVar56 < 0.0) {
      dVar56 = sqrt(dVar56);
    }
    else {
      auVar58._8_8_ = 0;
      auVar58._0_8_ = dVar56;
      auVar38 = vsqrtsd_avx(auVar58,auVar58);
      dVar56 = auVar38._0_8_;
    }
    auVar59._8_8_ = 0;
    auVar59._0_8_ = shenergy;
    if (shenergy < 0.0) {
      dVar151 = sqrt(shenergy);
    }
    else {
      auVar38 = vsqrtsd_avx(auVar59,auVar59);
      dVar151 = auVar38._0_8_;
    }
    auVar97._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar47];
    auVar97._8_8_ = in_XMM12_Qb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dx;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = xlength * 0.5 + x0;
    auVar38 = vfnmadd132sd_fma(auVar97,auVar136,auVar2);
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar56 * a0y,dVar56 * a0z
               ,xsigma,sigma0,auVar38._0_8_,x0,b_sign,phase,y00,z00,false,0.0,sscos,1.0,xtarget,
               ytarget,ztarget);
    uVar155 = 0;
    auVar98._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar47];
    auVar98._8_8_ = in_XMM12_Qb;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dx;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = xlength * 0.5 + x0;
    auVar38 = vfnmadd132sd_fma(auVar98,auVar137,auVar3);
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar151 * a0y,
               dVar151 * a0z,xsigma,sigma0,auVar38._0_8_,x0,b_sign,shphase,y00,z00,true,0.0,sscos,
               2.0,xtarget,ytarget,ztarget);
  }
  else {
    uVar155 = 0;
    auVar96._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar47];
    auVar96._8_8_ = in_XMM12_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dx;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = xlength * 0.5 + x0;
    auVar38 = vfnmadd132sd_fma(auVar96,auVar135,auVar1);
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z,xsigma,sigma0,
               auVar38._0_8_,x0,b_sign,phase,y00,z00,false,0.0,sscos,1.0,xtarget,ytarget,ztarget);
  }
  if ((phi != 0.0) || (NAN(phi))) {
    auVar99._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar47];
    auVar99._8_8_ = in_XMM12_Qb;
    dVar116 = -x0;
    dVar148 = -y00;
    dVar151 = -z00;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dx;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = xlength * 0.5 - x0;
    auVar38 = vfnmadd132sd_fma(auVar99,auVar95,auVar4);
    dVar55 = auVar38._0_8_;
    _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
         super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
    dVar56 = a0z;
    dVar57 = phi;
    dVar54 = a0y;
  }
  else {
    bVar44 = std::operator==(&lp_reflection1,"xy");
    uVar43 = psr;
    if (bVar44) {
      bVar44 = std::operator==(&f_reflection1,"y");
      dVar151 = -a0y;
      lVar52 = (ulong)!bVar44 * (long)a0y;
      bVar45 = std::operator==(&f_reflection1,"z");
      auVar100._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar47];
      auVar100._8_8_ = in_XMM12_Qb;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dx;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = xlength * 0.5 + x0;
      auVar38 = vfnmadd132sd_fma(auVar100,auVar60,auVar5);
      auVar61._0_8_ = -z00;
      auVar61._8_8_ = 0x8000000000000000;
      dVar56 = (double)vmovlpd_avx(auVar61);
      spatial_region::f_init_focused
                ((spatial_region *)
                 uVar43._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                 (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                 (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                 auVar38._0_8_,x0,b_sign,phase,y00,dVar56,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                );
      bVar44 = std::operator==(&lp_reflection2,"xz");
      uVar43 = psr;
      if (bVar44) {
        bVar44 = std::operator==(&f_reflection2,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar101._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar101._8_8_ = in_XMM12_Qb;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dx;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = xlength * 0.5 + x0;
        auVar38 = vfnmadd132sd_fma(auVar101,auVar62,auVar6);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                  );
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection2,"y");
        dVar151 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar102._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar102._8_8_ = uVar155;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dx;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = xlength * 0.5 + x0;
        auVar38 = vfnmadd132sd_fma(auVar102,auVar63,auVar7);
        auVar64._0_8_ = -z00;
        auVar64._8_8_ = 0x8000000000000000;
        dVar56 = (double)vmovlpd_avx(auVar64);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,x0,b_sign,phase,-y00,dVar56,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        bVar44 = std::operator==(&lp_reflection3,"yz");
        uVar43 = psr;
        if (!bVar44) goto LAB_0011947d;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar103._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar103._8_8_ = uVar155;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dx;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar103,auVar65,auVar8);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                  );
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar151 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar104._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar104._8_8_ = uVar155;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dx;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar104,auVar66,auVar9);
        auVar67._0_8_ = -z00;
        auVar67._8_8_ = 0x8000000000000000;
        dVar56 = (double)vmovlpd_avx(auVar67);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,y00,dVar56,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar105._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar105._8_8_ = uVar155;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dx;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar105,auVar68,auVar10);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar54 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
        bVar44 = std::operator==(&f_reflection2,"z");
        dVar56 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
        auVar106._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar106._8_8_ = uVar155;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dx;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar106,auVar69,auVar11);
        dVar55 = auVar38._0_8_;
        dVar151 = -z00;
        dVar116 = -x0;
        dVar148 = -y00;
      }
      else {
        bVar44 = std::operator==(&lp_reflection2,"yz");
        uVar43 = psr;
        if (!bVar44) goto LAB_0011947d;
        bVar44 = std::operator==(&f_reflection2,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar110._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar110._8_8_ = in_XMM12_Qb;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dx;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar110,auVar73,auVar16);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                  );
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection2,"y");
        dVar151 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar111._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar111._8_8_ = uVar155;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dx;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar111,auVar74,auVar17);
        auVar75._0_8_ = -z00;
        auVar75._8_8_ = 0x8000000000000000;
        dVar56 = (double)vmovlpd_avx(auVar75);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,y00,dVar56,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        bVar44 = std::operator==(&lp_reflection3,"xz");
        uVar43 = psr;
        if (!bVar44) goto LAB_0011947d;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar112._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar112._8_8_ = uVar155;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dx;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar112,auVar76,auVar18);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar113._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar113._8_8_ = uVar155;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dx;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = xlength * 0.5 + x0;
        auVar38 = vfnmadd132sd_fma(auVar113,auVar77,auVar19);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                  );
        uVar43 = psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar151 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar114._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar114._8_8_ = uVar155;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dx;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar114,auVar78,auVar20);
        auVar79._0_8_ = -z00;
        auVar79._8_8_ = 0x8000000000000000;
        dVar56 = (double)vmovlpd_avx(auVar79);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar151 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,-y00,dVar56,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        bVar44 = std::operator==(&f_reflection3,"y");
        dVar54 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
        bVar44 = std::operator==(&f_reflection2,"z");
        dVar56 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
        auVar115._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar115._8_8_ = uVar155;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dx;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = xlength * 0.5 + x0;
        auVar38 = vfnmadd132sd_fma(auVar115,auVar80,auVar21);
        dVar55 = auVar38._0_8_;
        dVar151 = -z00;
        dVar116 = x0;
        dVar148 = -y00;
      }
    }
    else {
      bVar44 = std::operator==(&lp_reflection1,"xz");
      uVar43 = psr;
      if (bVar44) {
        bVar44 = std::operator==(&f_reflection1,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection1,"z");
        auVar107._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar107._8_8_ = in_XMM12_Qb;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dx;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = xlength * 0.5 + x0;
        auVar38 = vfnmadd132sd_fma(auVar107,auVar70,auVar12);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,ztarget
                  );
        bVar44 = std::operator==(&lp_reflection2,"yz");
        uVar43 = psr;
        if (!bVar44) goto LAB_0011947d;
        bVar44 = std::operator==(&f_reflection2,"y");
        dVar56 = -a0y;
        lVar52 = (ulong)!bVar44 * (long)a0y;
        bVar45 = std::operator==(&f_reflection2,"z");
        auVar108._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar47];
        auVar108._8_8_ = in_XMM12_Qb;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dx;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = xlength * 0.5 - x0;
        auVar38 = vfnmadd132sd_fma(auVar108,auVar71,auVar13);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)bVar44 * (long)dVar56 + lVar52),
                   (double)((ulong)bVar45 * (long)-a0z + (ulong)!bVar45 * (long)a0z),xsigma,sigma0,
                   auVar38._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,ytarget,
                   ztarget);
        _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        pbVar53 = &f_reflection2;
        bVar44 = std::operator==(pbVar53,"y");
      }
      else {
        bVar44 = std::operator==(&lp_reflection1,"yz");
        _Var48._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        if (!bVar44) goto LAB_0011947d;
        pbVar53 = &f_reflection1;
        bVar44 = std::operator==(pbVar53,"y");
      }
      dVar54 = (double)((ulong)bVar44 * (long)-a0y + (ulong)!bVar44 * (long)a0y);
      bVar44 = std::operator==(pbVar53,"z");
      dVar116 = -x0;
      dVar56 = (double)((ulong)bVar44 * (long)-a0z + (ulong)!bVar44 * (long)a0z);
      auVar109._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar47];
      auVar109._8_8_ = in_XMM13_Qb;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dx;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = xlength * 0.5 - x0;
      auVar38 = vfnmadd132sd_fma(auVar109,auVar72,auVar15);
      dVar55 = auVar38._0_8_;
      dVar151 = z00;
      dVar148 = y00;
    }
    dVar57 = 0.0;
  }
  spatial_region::f_init_focused
            ((spatial_region *)
             _Var48._M_t.
             super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar54,dVar56,xsigma,sigma0
             ,dVar55,dVar116,b_sign,phase,dVar148,dVar151,true,dVar57,sscos,1.0,xtarget,ytarget,
             ztarget);
LAB_0011947d:
  std::__cxx11::string::~string((string *)&f_reflection3);
  std::__cxx11::string::~string((string *)&f_reflection2);
  std::__cxx11::string::~string((string *)&f_reflection1);
  std::__cxx11::string::~string((string *)&lp_reflection3);
  std::__cxx11::string::~string((string *)&lp_reflection2);
  std::__cxx11::string::~string((string *)&lp_reflection1);
  return;
}

Assistant:

void init_fields()
{
    int i = mpi_rank;
    if (f_envelope=="focused")
    {
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }
        if (shenergy == 0) 
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
        else  // adding second harmonic
        {
            double alpha, beta;
            alpha = sqrt(1 - shenergy);
            beta = sqrt(shenergy);
            psr->f_init_focused(a0y * alpha, a0z * alpha, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
            psr->f_init_focused(a0y * beta, a0z * beta, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign, shphase,y00,z00, 1, 0,sscos, 2,xtarget,ytarget,ztarget);
        }
        if (phi!=0) {
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,phi,sscos,1,xtarget,ytarget,ztarget);
        }
        else if (lp_reflection1=="xy") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="xz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="yz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="xz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
        }
        else if (lp_reflection1=="xz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            }
        }
        else if (lp_reflection1=="yz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
        }
    } else if (f_envelope == "uniformB") {
        psr->f_init_uniformB(a0y, a0z);
    }
    else // f_envelope == "cos"
    {
        if (f_envelope != "cos") {
            if (mpi_rank == 0) {
                cout << TERM_RED << "Unknown f_envelope value [" << f_envelope << "] during initialization"
                     << TERM_NO_COLOR << endl;
            }
        }
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }

        if (phi_rotate != 0) {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,1,phi_rotate,xtarget,ytarget,ztarget);
        } else {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,true,0,xtarget,ytarget,ztarget);
            if (phi!=0) {
                psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2-x0-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,phi,xtarget,ytarget,ztarget);
            }
            else if (lp_reflection1=="xy") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="xz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="yz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
                else if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="xz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
            }
            else if (lp_reflection1=="xz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection1=="yz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
            }
        }
    }
}